

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O0

ImGuiWindowSettings * __thiscall
ImChunkStream<ImGuiWindowSettings>::alloc_chunk(ImChunkStream<ImGuiWindowSettings> *this,size_t sz)

{
  int in_ESI;
  int *in_RDI;
  int off;
  size_t HDR_SZ;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar1;
  
  iVar1 = *in_RDI;
  ImVector<char>::resize
            ((ImVector<char> *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),
             (int)((ulong)in_RDI >> 0x20));
  *(uint *)(*(long *)(in_RDI + 2) + (long)iVar1) = in_ESI + 7U & 0xfffffffc;
  return (ImGuiWindowSettings *)(*(long *)(in_RDI + 2) + (long)iVar1 + 4);
}

Assistant:

T*      alloc_chunk(size_t sz)      { size_t HDR_SZ = 4; sz = ((HDR_SZ + sz) + 3u) & ~3u; int off = Buf.Size; Buf.resize(off + (int)sz); ((int*)(void*)(Buf.Data + off))[0] = (int)sz; return (T*)(void*)(Buf.Data + off + (int)HDR_SZ); }